

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

int lsvm::system::init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  object_class *name;
  package *system;
  object_class *in_stack_ffffffffffffffc8;
  symbol *in_stack_ffffffffffffffd0;
  object_class *cls;
  undefined8 in_stack_ffffffffffffffd8;
  object_class *poVar1;
  uint16_t uVar2;
  object_class *in_stack_ffffffffffffffe0;
  symbol *in_stack_ffffffffffffffe8;
  package *in_stack_fffffffffffffff0;
  
  uVar2 = (uint16_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  memory::initialize();
  processes_count = 0;
  processes = 0;
  current_process = 0;
  symbol::new_symbol((char *)in_stack_ffffffffffffffd0);
  name = (object_class *)object::new_package(in_stack_ffffffffffffffd0);
  cls = name;
  symbol::new_symbol((char *)name);
  Class = object::new_class(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                            in_stack_ffffffffffffffe0,uVar2);
  object::define_class((package *)cls,in_stack_ffffffffffffffc8);
  poVar1 = name;
  symbol::new_symbol((char *)cls);
  uVar2 = (uint16_t)((ulong)poVar1 >> 0x30);
  Object = object::new_class(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                             in_stack_ffffffffffffffe0,uVar2);
  object::define_class((package *)cls,in_stack_ffffffffffffffc8);
  poVar1 = name;
  symbol::new_symbol((char *)cls);
  Nil = object::new_class(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,poVar1,uVar2);
  object::define_class((package *)cls,in_stack_ffffffffffffffc8);
  symbol::new_symbol((char *)cls);
  Integer = object::new_class(in_stack_fffffffffffffff0,(symbol *)name,poVar1,uVar2);
  object::define_class((package *)cls,in_stack_ffffffffffffffc8);
  symbol::new_symbol((char *)cls);
  object::define_method(cls,(symbol *)in_stack_ffffffffffffffc8,(block *)0x10a8b8);
  return extraout_EAX;
}

Assistant:

void init(){
    lsvm::memory::initialize();
    // initialize process
    processes_count = 0;
    processes = null;
    current_process = null;

    // initialize global package
    package* system = lsvm::object::new_package(sym("system"));

    // initialize Class
    Class = lsvm::object::new_class(system,sym("Class"),null,0);
    lsvm::object::define_class(system,Class);

    Object = lsvm::object::new_class(system,sym("Object"),null,0);
    lsvm::object::define_class(system,Object);

    Nil = lsvm::object::new_class(system,sym("Nil"),Object,0);
    lsvm::object::define_class(system,Nil);

    Integer = lsvm::object::new_class(system,sym("Integer"),Object,0);
    lsvm::object::define_class(system,Integer);

    // defining methods for Object
    lsvm::object::define_method(Object,sym("hash"),&hash_block);
}